

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O2

bool slang::ast::Bitstream::canBeTarget
               (StreamingConcatenationExpression *lhs,Expression *rhs,SourceLocation assignLoc,
               ASTContext *context)

{
  bool bVar1;
  Type *pTVar2;
  Diagnostic *pDVar3;
  size_t arg;
  StreamingConcatenationExpression *pSVar4;
  size_t arg_00;
  Diagnostic *pDVar5;
  SourceLocation SVar6;
  SourceRange range;
  SourceRange *with;
  SourceRange *dynamic;
  string local_70;
  string local_50;
  SourceLocation SVar7;
  
  if (rhs->kind != Streaming) {
    pTVar2 = not_null<const_slang::ast::Type_*>::get(&rhs->type);
    bVar1 = Type::isBitstreamType(pTVar2,false);
    if (!bVar1) {
      pDVar3 = ASTContext::addDiag(context,(DiagCode)0x2d0007,assignLoc);
      pTVar2 = not_null<const_slang::ast::Type_*>::get(&rhs->type);
      pDVar3 = ast::operator<<(pDVar3,pTVar2);
      SVar7 = (lhs->super_Expression).sourceRange.startLoc;
      SVar6 = (lhs->super_Expression).sourceRange.endLoc;
      goto LAB_001e1058;
    }
  }
  dynamic = (SourceRange *)0x0;
  with = (SourceRange *)0x0;
  bVar1 = withAfterDynamic(lhs,&dynamic,&with);
  if (bVar1) {
    pDVar3 = ASTContext::addDiag(context,(DiagCode)0x2f0007,*with);
    SVar7 = dynamic->startLoc;
    SVar6 = dynamic->endLoc;
  }
  else {
    if (((context->flags).m_bits & 2) != 0) {
      return true;
    }
    arg = StreamingConcatenationExpression::bitstreamWidth(lhs);
    if (rhs->kind == Streaming) {
      pSVar4 = Expression::as<slang::ast::StreamingConcatenationExpression>(rhs);
      arg_00 = StreamingConcatenationExpression::bitstreamWidth(pSVar4);
      bVar1 = StreamingConcatenationExpression::isFixedSize(lhs);
      if ((bVar1) && (bVar1 = StreamingConcatenationExpression::isFixedSize(pSVar4), bVar1)) {
        if (arg == arg_00) {
          return true;
        }
      }
      else {
        bVar1 = dynamicSizesMatch<slang::ast::StreamingConcatenationExpression,slang::ast::StreamingConcatenationExpression>
                          (lhs,pSVar4);
        if (bVar1) {
          return true;
        }
      }
    }
    else {
      pTVar2 = not_null<const_slang::ast::Type_*>::get(&rhs->type);
      bVar1 = Type::isFixedSize(pTVar2);
      if (!bVar1) {
        return true;
      }
      pTVar2 = not_null<const_slang::ast::Type_*>::get(&rhs->type);
      arg_00 = Type::bitstreamWidth(pTVar2);
      if (arg <= arg_00) {
        return true;
      }
    }
    pDVar3 = ASTContext::addDiag(context,(DiagCode)0x2b0007,assignLoc);
    if (rhs->kind == Streaming) {
      formatWidth<slang::ast::StreamingConcatenationExpression>(&local_50,lhs,DestFill);
      pDVar5 = Diagnostic::operator<<(pDVar3,&local_50);
      pSVar4 = Expression::as<slang::ast::StreamingConcatenationExpression>(rhs);
      formatWidth<slang::ast::StreamingConcatenationExpression>(&local_70,pSVar4,Source);
      Diagnostic::operator<<(pDVar5,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      pDVar5 = Diagnostic::operator<<(pDVar3,arg);
      Diagnostic::operator<<(pDVar5,arg_00);
    }
    Diagnostic::operator<<(pDVar3,(lhs->super_Expression).sourceRange);
    if (rhs->kind != Streaming) {
      return false;
    }
    SVar7 = (rhs->sourceRange).startLoc;
    SVar6 = (rhs->sourceRange).endLoc;
  }
LAB_001e1058:
  range.endLoc = SVar6;
  range.startLoc = SVar7;
  Diagnostic::operator<<(pDVar3,range);
  return false;
}

Assistant:

bool Bitstream::canBeTarget(const StreamingConcatenationExpression& lhs, const Expression& rhs,
                            SourceLocation assignLoc, const ASTContext& context) {
    if (rhs.kind != ExpressionKind::Streaming && !rhs.type->isBitstreamType()) {
        context.addDiag(diag::BadStreamSourceType, assignLoc) << *rhs.type << lhs.sourceRange;
        return false;
    }

    const SourceRange *dynamic = nullptr, *with = nullptr;
    if (withAfterDynamic(lhs, dynamic, with)) {
        context.addDiag(diag::BadStreamWithOrder, *with) << *dynamic;
        return false;
    }

    if (context.inUnevaluatedBranch())
        return true; // No size check in an unevaluated conditional branch

    size_t targetWidth = lhs.bitstreamWidth();
    size_t sourceWidth;
    bool good = true;

    if (rhs.kind != ExpressionKind::Streaming) {
        if (!rhs.type->isFixedSize())
            return true; // Sizes checked at constant evaluation or runtime

        sourceWidth = rhs.type->bitstreamWidth();
        good = targetWidth <= sourceWidth;
    }
    else {
        auto& source = rhs.as<StreamingConcatenationExpression>();
        sourceWidth = source.bitstreamWidth();
        if (lhs.isFixedSize() && source.isFixedSize())
            good = targetWidth == sourceWidth;
        else
            good = dynamicSizesMatch(lhs, source);
    }

    if (!good) {
        auto& diag = context.addDiag(diag::BadStreamSize, assignLoc);
        if (rhs.kind != ExpressionKind::Streaming)
            diag << targetWidth << sourceWidth;
        else {
            diag << formatWidth(lhs, BitstreamSizeMode::DestFill)
                 << formatWidth(rhs.as<StreamingConcatenationExpression>(),
                                BitstreamSizeMode::Source);
        }

        diag << lhs.sourceRange;
        if (rhs.kind == ExpressionKind::Streaming)
            diag << rhs.sourceRange;
    }

    return good;
}